

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::BufferVkImpl::BufferVkImpl
          (BufferVkImpl *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *BuffViewObjMemAllocator,RenderDeviceVkImpl *pRenderDeviceVk,
          BufferDesc *BuffDesc,RESOURCE_STATE InitialState,VkBuffer vkBuffer)

{
  BufferBase<Diligent::EngineVkImplTraits>::BufferBase
            (&this->super_BufferBase<Diligent::EngineVkImplTraits>,pRefCounters,
             BuffViewObjMemAllocator,pRenderDeviceVk,BuffDesc,false);
  (this->super_BufferBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>.
  super_ObjectBase<Diligent::IBufferVk>.super_RefCountedObject<Diligent::IBufferVk>.super_IBufferVk.
  super_IBuffer.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00891240;
  this->m_DynamicOffsetAlignment = 0;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_BufferMemoryAlignedOffset = 0;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_VulkanBuffer).m_VkObject = vkBuffer;
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)0x0;
  (this->m_MemoryAllocation).UnalignedOffset = 0;
  (this->m_MemoryAllocation).Size = 0;
  (this->super_BufferBase<Diligent::EngineVkImplTraits>).m_State = InitialState;
  return;
}

Assistant:

BufferVkImpl::BufferVkImpl(IReferenceCounters*        pRefCounters,
                           FixedBlockMemoryAllocator& BuffViewObjMemAllocator,
                           RenderDeviceVkImpl*        pRenderDeviceVk,
                           const BufferDesc&          BuffDesc,
                           RESOURCE_STATE             InitialState,
                           VkBuffer                   vkBuffer) :
    TBufferBase{
        pRefCounters,
        BuffViewObjMemAllocator,
        pRenderDeviceVk,
        BuffDesc,
        false,
    },
    m_VulkanBuffer{vkBuffer}
{
    SetState(InitialState);
}